

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Refal2::CScanner::processingNumber(CScanner *this,char c)

{
  CToken *token;
  bool bVar1;
  TDigit TVar2;
  TDigitIndex TVar3;
  CArbitraryInteger number;
  CArbitraryInteger local_60;
  string local_40;
  
  if ((byte)(c - 0x30U) < 10) {
    std::__cxx11::string::push_back((char)this + -0x50);
    return;
  }
  if (c != '/') {
    error(this,E_UnclosedNumber,c);
    this->state = S_Initial;
    processing(this,c);
    return;
  }
  CArbitraryInteger::CArbitraryInteger(&local_60);
  bVar1 = CArbitraryInteger::SetValueByText
                    (&local_60,
                     &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                      super_CQualifierParser.token.word);
  if (!bVar1) {
    __assert_fail("isNumber",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x270,"void Refal2::CScanner::processingNumber(char)");
  }
  TVar3 = CArbitraryInteger::GetSize(&local_60);
  if ((TVar3 != 0) && (local_60.isNegative == true)) {
    __assert_fail("number.IsZero() || !number.IsNegative()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x271,"void Refal2::CScanner::processingNumber(char)");
  }
  token = &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.
           token;
  token->type = TT_Number;
  TVar3 = CArbitraryInteger::GetSize(&local_60);
  if (TVar3 == 0) {
    TVar2 = 0;
  }
  else {
    TVar2 = CArbitraryInteger::GetDigit(&local_60,0);
  }
  (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.number
       = TVar2;
  TVar3 = CArbitraryInteger::GetSize(&local_60);
  if (1 < TVar3) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"a constant value is too large for the number (max 2^24 - 1)","")
    ;
    CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,&local_40,token);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type =
       TT_Number;
  CParser::AddToken(&this->super_CParser);
  this->state = S_Initial;
  if (local_60.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CScanner::processingNumber( char c )
{
	if( IsDigit( c ) ) {
		token.word += c;
	} else if( c == LimiterOfSymbol ) {
		CArbitraryInteger number;
		const bool isNumber = number.SetValueByText( token.word );
		assert( isNumber );
		assert( number.IsZero() || !number.IsNegative() );
		token.type = TT_Number;
		token.number = number.IsZero() ? 0 : number.GetDigit( 0 );
		if( number.GetSize() > 1 ) {
			CErrorsHelper::RaiseError( ES_Error,
				"a constant value is too large for the number (max 2^24 - 1)",
				token );
		}
		addToken( TT_Number );
		state = S_Initial;
	} else {
		error( E_UnclosedNumber, c );
		state = S_Initial;
		processing( c );
	}
}